

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O2

GCstr * lj_str_rehash_chain(lua_State *L,StrHash hashc,char *str,MSize len)

{
  uint uVar1;
  global_State *g;
  GCRef *pGVar2;
  GCstr *pGVar3;
  ulong uVar4;
  StrHash SVar5;
  GCstr *pGVar6;
  uint uVar7;
  byte bVar8;
  
  g = (global_State *)(L->glref).ptr64;
  bVar8 = 0;
  if ((g->gc).state == '\x03') {
    bVar8 = (g->gc).currentwhite ^ 3;
  }
  pGVar2 = (g->str).tab;
  uVar1 = (g->str).mask;
  uVar7 = hashc & uVar1;
  pGVar6 = (GCstr *)pGVar2[uVar7].gcptr64;
  pGVar2[uVar7].gcptr64 = 1;
  (g->str).second = '\x01';
  do {
    while( true ) {
      if (pGVar6 == (GCstr *)0x0) {
        pGVar6 = lj_str_new(L,str,(ulong)len);
        return pGVar6;
      }
      pGVar3 = (GCstr *)(pGVar6->nextgc).gcptr64;
      if (bVar8 != 0) break;
LAB_0010ac5a:
      SVar5 = pGVar6->hash;
      if (pGVar6->hashalg == '\0') {
        SVar5 = (*hash_dense)((g->str).seed,SVar5,(char *)(pGVar6 + 1),pGVar6->len);
        pGVar6->hash = SVar5;
        pGVar6->hashalg = '\x01';
      }
      uVar7 = SVar5 & uVar1;
      uVar4 = pGVar2[uVar7].gcptr64;
      (pGVar6->nextgc).gcptr64 = uVar4 & 0xfffffffffffffffe;
      pGVar2[uVar7].gcptr64 = (ulong)((uint)uVar4 & 1) | (ulong)pGVar6;
      pGVar6 = pGVar3;
    }
    if ((bVar8 & (pGVar6->marked ^ 3)) != 0) {
      pGVar6->marked = (g->gc).currentwhite & 3 | pGVar6->marked & 0xf8;
      goto LAB_0010ac5a;
    }
    lj_str_free(g,pGVar6);
    pGVar6 = pGVar3;
  } while( true );
}

Assistant:

static LJ_NOINLINE GCstr *lj_str_rehash_chain(lua_State *L, StrHash hashc,
					      const char *str, MSize len)
{
  global_State *g = G(L);
  int ow = g->gc.state == GCSsweepstring ? otherwhite(g) : 0;  /* Sweeping? */
  GCRef *strtab = g->str.tab;
  MSize strmask = g->str.mask;
  GCobj *o = gcref(strtab[hashc & strmask]);
  setgcrefp(strtab[hashc & strmask], (void *)((uintptr_t)1));
  g->str.second = 1;
  while (o) {
    uintptr_t u;
    GCobj *next = gcnext(o);
    GCstr *s = gco2str(o);
    StrHash hash;
    if (ow) {  /* Must sweep while rechaining. */
      if (((o->gch.marked ^ LJ_GC_WHITES) & ow)) {  /* String alive? */
	lj_assertG(!isdead(g, o) || (o->gch.marked & LJ_GC_FIXED),
		   "sweep of undead string");
	makewhite(g, o);
      } else {  /* Free dead string. */
	lj_assertG(isdead(g, o) || ow == LJ_GC_SFIXED,
		   "sweep of unlive string");
	lj_str_free(g, s);
	o = next;
	continue;
      }
    }
    hash = s->hash;
    if (!s->hashalg) {  /* Rehash with secondary hash. */
      hash = hash_dense(g->str.seed, hash, strdata(s), s->len);
      s->hash = hash;
      s->hashalg = 1;
    }
    /* Rechain. */
    hash &= strmask;
    u = gcrefu(strtab[hash]);
    setgcrefp(o->gch.nextgc, (u & ~(uintptr_t)1));
    setgcrefp(strtab[hash], ((uintptr_t)o | (u & 1)));
    o = next;
  }
  /* Try to insert the pending string again. */
  return lj_str_new(L, str, len);
}